

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

int __thiscall Minisat::Solver::getRestartLevel(Solver *this)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  long lVar4;
  int *piVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  Heap<Minisat::Solver::VarOrderLt> *this_00;
  long lVar10;
  uint32_t uVar11;
  int bLevel;
  ulong uVar12;
  long lVar13;
  lbool local_3a;
  lbool local_39;
  ulong local_38;
  
  uVar11 = (this->restart).selection_type;
  if (uVar11 != 0) {
    if (uVar11 == 4) {
      if ((this->trail_lim).sz == 0) {
LAB_00118b37:
        uVar11 = 0;
      }
      else {
        iVar7 = rand();
        uVar11 = iVar7 % (this->trail_lim).sz;
      }
    }
    else {
      if (uVar11 != 3) {
        lVar13 = 0x288;
        if (VSIDS_DISTANCE < this->current_heuristic) {
          lVar13 = (ulong)(this->current_heuristic != CHB) * 0x20 + 0x278;
        }
        iVar7 = -1;
LAB_00118968:
        do {
          if (iVar7 != -1) {
            lVar10 = (long)iVar7;
            local_39.value = (this->assigns).data[lVar10].value;
            bVar6 = lbool::operator!=(&local_39,(lbool)0x2);
            if ((!bVar6) && ((this->decision).data[lVar10] != '\0')) {
              uVar3 = (this->trail_lim).sz;
              uVar8 = (ulong)uVar3;
              if ((int)uVar3 < 1) {
                uVar8 = 0;
              }
              for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
                lVar4 = *(long *)((long)&this->_vptr_Solver + lVar13);
                dVar2 = *(double *)(lVar4 + lVar10 * 8);
                pdVar1 = (double *)
                         (lVar4 + (long)((this->trail).data[(this->trail_lim).data[uVar12]].x >> 1)
                                  * 8);
                if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) goto LAB_00118a07;
              }
              uVar12 = 0;
LAB_00118a07:
              Heap<Minisat::Solver::VarOrderLt>::insert(this->order_heap,iVar7);
              bLevel = (int)uVar12;
              uVar12 = uVar12 & 0xffffffff;
              if ((bLevel != 0) && (1 < (this->restart).selection_type)) {
                local_38 = uVar12;
                cancelUntil(this,bLevel,false);
                iVar7 = -1;
                do {
                  if (iVar7 != -1) {
                    lVar10 = (long)iVar7;
                    local_3a.value = (this->assigns).data[lVar10].value;
                    bVar6 = lbool::operator!=(&local_3a,(lbool)0x2);
                    if ((!bVar6) && ((this->decision).data[lVar10] != '\0')) goto LAB_00118a92;
                  }
                  this_00 = this->order_heap;
                  if ((this_00->heap).sz == 0) {
                    iVar7 = -1;
                    goto LAB_00118ad9;
                  }
                  iVar7 = Heap<Minisat::Solver::VarOrderLt>::removeMin(this_00);
                } while( true );
              }
              if (bLevel != 0) goto LAB_00118ae1;
              goto LAB_00118b37;
            }
          }
          if ((this->order_heap->heap).sz == 0) goto LAB_00118b37;
          iVar7 = Heap<Minisat::Solver::VarOrderLt>::removeMin(this->order_heap);
        } while( true );
      }
      uVar11 = (this->trail_lim).sz;
    }
  }
  return uVar11;
LAB_00118a92:
  if (*(double *)(*(long *)((long)&this->_vptr_Solver + lVar13) + lVar10 * 8) <=
      (double)((this->trail).data[(this->trail_lim).data[local_38 - 1]].x >> 1)) {
    this_00 = this->order_heap;
LAB_00118ad9:
    uVar12 = local_38;
    Heap<Minisat::Solver::VarOrderLt>::insert(this_00,iVar7);
LAB_00118ae1:
    (this->restart).savedDecisions = (this->restart).savedDecisions + uVar12;
    piVar5 = (this->trail_lim).data;
    piVar9 = piVar5 + uVar12;
    if (bLevel == (this->trail_lim).sz) {
      piVar9 = &(this->trail).sz;
    }
    (this->restart).savedPropagations =
         ((long)*piVar9 - (long)*piVar5) + (this->restart).savedPropagations;
    (this->restart).partialRestarts = (this->restart).partialRestarts + 1;
    return bLevel;
  }
  goto LAB_00118968;
}

Assistant:

int Solver::getRestartLevel()
{
    // stay on the current level?
    if (restart.selection_type == 3) return decisionLevel();
    if (restart.selection_type == 4) return decisionLevel() == 0 ? 0 : rand() % decisionLevel();

    if (restart.selection_type >= 1) {

        bool repeatReusedTrail = false;
        Var next = var_Undef;
        int restartLevel = 0;

        const vec<double> &restart_activity = usesVSIDS() ? activity_VSIDS : (usesCHB() ? activity_CHB : activity_distance);

        do {
            repeatReusedTrail = false; // get it right this time?

            // Activity based selection
            while (next == var_Undef || value(next) != l_Undef ||
                   !decision[next]) // found a yet unassigned variable with the highest activity among the unassigned variables
                if (order_heap->empty()) {
                    // we cannot compare to any other variable, hence, we have SAT already
                    return 0;
                } else {
                    next = order_heap->removeMin(); // get next element
                }

            // based on variable next, either check for reusedTrail, or matching Trail!
            // activity of the next decision literal
            restartLevel = 0;
            for (int i = 0; i < decisionLevel(); ++i) {
                if (restart_activity[var(trail[trail_lim[i]])] < restart_activity[next]) {
                    restartLevel = i;
                    break;
                }
            }
            // put the decision literal back, so that it can be used for the next decision
            order_heap->insert(next);

            // reused trail
            if (restart.selection_type > 1 && restartLevel > 0) { // check whether jumping higher would be "more correct"
                cancelUntil(restartLevel);
                Var more = var_Undef;
                while (more == var_Undef || value(more) != l_Undef || !decision[more])
                    if (order_heap->empty()) {
                        more = var_Undef;
                        break;
                    } else {
                        more = order_heap->removeMin();
                    }

                // actually, would have to jump higher than the current level!
                if (more != var_Undef && restart_activity[more] > var(trail[trail_lim[restartLevel - 1]])) {
                    repeatReusedTrail = true;
                    next = more; // no need to insert, and get back afterwards again!
                } else {
                    order_heap->insert(more);
                }
            }
        } while (repeatReusedTrail);

        // stats
        if (restartLevel > 0) { // if a partial restart is done
            restart.savedDecisions += restartLevel;
            const int thisPropSize = restartLevel == decisionLevel() ? trail.size() : trail_lim[restartLevel];
            restart.savedPropagations += (thisPropSize - trail_lim[0]); // number of literals that do not need to be propagated
            restart.partialRestarts++;
        }

        // return restart level
        return restartLevel;
    }
    return 0;
}